

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void ZopfliLengthsToSymbols(uint *lengths,size_t n,uint maxbits,uint *symbols)

{
  undefined8 *__s;
  void *__ptr;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = maxbits + 1;
  __s = (undefined8 *)malloc((ulong)uVar4 * 8);
  __ptr = malloc((ulong)uVar4 * 8);
  if (n != 0) {
    uVar1 = 0;
    do {
      symbols[uVar1] = 0;
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < n);
  }
  memset(__s,0,(ulong)(maxbits + 1 + (uint)(uVar4 == 0)) << 3);
  if (n != 0) {
    uVar1 = 0;
    do {
      __s[lengths[uVar1]] = __s[lengths[uVar1]] + 1;
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < n);
  }
  *__s = 0;
  if (maxbits != 0) {
    uVar1 = 2;
    if (2 < uVar4) {
      uVar1 = (ulong)uVar4;
    }
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = ((uVar3 & 0xffffffff) + __s[lVar2]) * 2;
      *(ulong *)((long)__ptr + lVar2 * 8 + 8) = uVar3 & 0xffffffff;
      lVar2 = lVar2 + 1;
    } while (uVar1 - 1 != lVar2);
  }
  if (n != 0) {
    uVar1 = 0;
    do {
      uVar3 = (ulong)lengths[uVar1];
      if (uVar3 != 0) {
        lVar2 = *(long *)((long)__ptr + uVar3 * 8);
        symbols[uVar1] = (uint)lVar2;
        *(long *)((long)__ptr + uVar3 * 8) = lVar2 + 1;
      }
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < n);
  }
  free(__s);
  free(__ptr);
  return;
}

Assistant:

void ZopfliLengthsToSymbols(const unsigned* lengths, size_t n, unsigned maxbits,
                            unsigned* symbols) {
  size_t* bl_count = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  size_t* next_code = (size_t*)malloc(sizeof(size_t) * (maxbits + 1));
  unsigned bits, i;
  unsigned code;

  for (i = 0; i < n; i++) {
    symbols[i] = 0;
  }

  /* 1) Count the number of codes for each code length. Let bl_count[N] be the
  number of codes of length N, N >= 1. */
  for (bits = 0; bits <= maxbits; bits++) {
    bl_count[bits] = 0;
  }
  for (i = 0; i < n; i++) {
    assert(lengths[i] <= maxbits);
    bl_count[lengths[i]]++;
  }
  /* 2) Find the numerical value of the smallest code for each code length. */
  code = 0;
  bl_count[0] = 0;
  for (bits = 1; bits <= maxbits; bits++) {
    code = (code + bl_count[bits-1]) << 1;
    next_code[bits] = code;
  }
  /* 3) Assign numerical values to all codes, using consecutive values for all
  codes of the same length with the base values determined at step 2. */
  for (i = 0;  i < n; i++) {
    unsigned len = lengths[i];
    if (len != 0) {
      symbols[i] = next_code[len];
      next_code[len]++;
    }
  }

  free(bl_count);
  free(next_code);
}